

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_CutPushUncontained
              (Vec_Wrd_t *vCutsI1,Vec_Wrd_t *vCutsI2,Vec_Wrd_t *vCutsN1,Vec_Wrd_t *vCutsN2,
              word CutI1,word CutI2,word CutN1,word CutN2)

{
  int local_48;
  int local_44;
  int k;
  int i;
  word CutI2_local;
  word CutI1_local;
  Vec_Wrd_t *vCutsN2_local;
  Vec_Wrd_t *vCutsN1_local;
  Vec_Wrd_t *vCutsI2_local;
  Vec_Wrd_t *vCutsI1_local;
  
  local_48 = 0;
  if (vCutsI1->nSize != vCutsN1->nSize) {
    __assert_fail("vCutsI1->nSize == vCutsN1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x282,
                  "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                 );
  }
  if (vCutsI2->nSize == vCutsN2->nSize) {
    local_44 = 0;
    while( true ) {
      if (vCutsI1->nSize <= local_44) {
        for (local_44 = 0; local_44 < vCutsI1->nSize; local_44 = local_44 + 1) {
          if (((((vCutsI1->pArray[local_44] & CutI1) != CutI1) ||
               ((vCutsI2->pArray[local_44] & CutI2) != CutI2)) ||
              ((vCutsN1->pArray[local_44] & CutN1) != CutN1)) ||
             ((vCutsN2->pArray[local_44] & CutN2) != CutN2)) {
            Vec_WrdWriteEntry(vCutsI1,local_48,vCutsI1->pArray[local_44]);
            Vec_WrdWriteEntry(vCutsI2,local_48,vCutsI2->pArray[local_44]);
            Vec_WrdWriteEntry(vCutsN1,local_48,vCutsN1->pArray[local_44]);
            Vec_WrdWriteEntry(vCutsN2,local_48,vCutsN2->pArray[local_44]);
            local_48 = local_48 + 1;
          }
        }
        Vec_WrdShrink(vCutsI1,local_48);
        Vec_WrdShrink(vCutsI2,local_48);
        Vec_WrdShrink(vCutsN1,local_48);
        Vec_WrdShrink(vCutsN2,local_48);
        Vec_WrdPush(vCutsI1,CutI1);
        Vec_WrdPush(vCutsI2,CutI2);
        Vec_WrdPush(vCutsN1,CutN1);
        Vec_WrdPush(vCutsN2,CutN2);
        return 0;
      }
      if ((((vCutsI1->pArray[local_44] & CutI1) == vCutsI1->pArray[local_44]) &&
          ((vCutsI2->pArray[local_44] & CutI2) == vCutsI2->pArray[local_44])) &&
         (((vCutsN1->pArray[local_44] & CutN1) == vCutsN1->pArray[local_44] &&
          ((vCutsN2->pArray[local_44] & CutN2) == vCutsN2->pArray[local_44])))) break;
      local_44 = local_44 + 1;
    }
    return 1;
  }
  __assert_fail("vCutsI2->nSize == vCutsN2->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                ,0x283,
                "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
               );
}

Assistant:

static inline int Sbl_CutPushUncontained( Vec_Wrd_t * vCutsI1, Vec_Wrd_t * vCutsI2, Vec_Wrd_t * vCutsN1, Vec_Wrd_t * vCutsN2, word CutI1, word CutI2, word CutN1, word CutN2 )
{
    int i, k = 0;
    assert( vCutsI1->nSize == vCutsN1->nSize );
    assert( vCutsI2->nSize == vCutsN2->nSize );
    for ( i = 0; i < vCutsI1->nSize; i++ )
        if ( (vCutsI1->pArray[i] & CutI1) == vCutsI1->pArray[i] && 
             (vCutsI2->pArray[i] & CutI2) == vCutsI2->pArray[i] && 
             (vCutsN1->pArray[i] & CutN1) == vCutsN1->pArray[i] && 
             (vCutsN2->pArray[i] & CutN2) == vCutsN2->pArray[i]  )
            return 1;
    for ( i = 0; i < vCutsI1->nSize; i++ )
        if ( (vCutsI1->pArray[i] & CutI1) != CutI1 ||
             (vCutsI2->pArray[i] & CutI2) != CutI2 || 
             (vCutsN1->pArray[i] & CutN1) != CutN1 || 
             (vCutsN2->pArray[i] & CutN2) != CutN2 )
        {
            Vec_WrdWriteEntry( vCutsI1, k, vCutsI1->pArray[i] );
            Vec_WrdWriteEntry( vCutsI2, k, vCutsI2->pArray[i] );
            Vec_WrdWriteEntry( vCutsN1, k, vCutsN1->pArray[i] );
            Vec_WrdWriteEntry( vCutsN2, k, vCutsN2->pArray[i] );
            k++;
        }
    Vec_WrdShrink( vCutsI1, k );
    Vec_WrdShrink( vCutsI2, k );
    Vec_WrdShrink( vCutsN1, k );
    Vec_WrdShrink( vCutsN2, k );
    Vec_WrdPush( vCutsI1, CutI1 );
    Vec_WrdPush( vCutsI2, CutI2 );
    Vec_WrdPush( vCutsN1, CutN1 );
    Vec_WrdPush( vCutsN2, CutN2 );
    return 0;
}